

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O1

void __thiscall leveldb::DBImpl::BackgroundCompaction(DBImpl *this)

{
  int iVar1;
  ManualCompaction *pMVar2;
  pointer ppFVar3;
  Logger *pLVar4;
  InternalKey *pIVar5;
  InternalKey *pIVar6;
  FileMetaData *pFVar7;
  uint64_t uVar8;
  uint64_t uVar9;
  Status SVar10;
  bool bVar11;
  Compaction *this_00;
  char *pcVar12;
  CompactionState *compact;
  _Alloc_hider _Var13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  long in_FS_OFFSET;
  Status status;
  LevelSummaryStorage tmp;
  InternalKey manual_end;
  Status local_148;
  string local_140;
  undefined1 local_120 [120];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  string local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  undefined1 local_58 [40];
  
  local_58._32_8_ = *(long *)(in_FS_OFFSET + 0x28);
  if (this->imm_ != (MemTable *)0x0) {
    if (*(__pthread_internal_list **)(in_FS_OFFSET + 0x28) ==
        (__pthread_internal_list *)local_58._32_8_) {
      CompactMemTable(this);
      return;
    }
    goto LAB_0066d20d;
  }
  pMVar2 = this->manual_compaction_;
  local_58._0_8_ = local_58 + 0x10;
  local_58._8_8_ = (pointer)0x0;
  local_58[0x10] = '\0';
  if (pMVar2 == (ManualCompaction *)0x0) {
    this_00 = VersionSet::PickCompaction(this->versions_);
  }
  else {
    this_00 = VersionSet::CompactRange(this->versions_,pMVar2->level,pMVar2->begin,pMVar2->end);
    pMVar2->done = this_00 == (Compaction *)0x0;
    if (this_00 != (Compaction *)0x0) {
      ppFVar3 = this_00->inputs_[0].
                super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                 &(ppFVar3[((long)this_00->inputs_[0].
                                  super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar3) *
                           0x20000000 + -0x100000000 >> 0x20]->largest).rep_);
    }
    pLVar4 = (this->options_).info_log;
    iVar1 = pMVar2->level;
    pIVar5 = pMVar2->begin;
    if (pIVar5 == (InternalKey *)0x0) {
      pcVar12 = "(begin)";
    }
    else {
      InternalKey::DebugString_abi_cxx11_((string *)&local_78,pMVar2->begin);
      pcVar12 = (char *)local_78._M_allocated_capacity;
    }
    pIVar6 = pMVar2->end;
    _Var13._M_p = "(end)";
    if (pIVar6 != (InternalKey *)0x0) {
      InternalKey::DebugString_abi_cxx11_(&local_98,pMVar2->end);
      _Var13._M_p = local_98._M_dataplus._M_p;
    }
    bVar11 = pMVar2->done;
    paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)"(end)";
    if (bVar11 == false) {
      InternalKey::DebugString_abi_cxx11_((string *)(local_120 + 0x68),(InternalKey *)local_58);
      paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_120._104_8_;
    }
    Log(pLVar4,"Manual compaction at level-%d from %s .. %s; will stop at %s\n",iVar1,pcVar12,
        _Var13._M_p,paVar14);
    if ((bVar11 == false) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._104_8_ != &local_a8)) {
      operator_delete((void *)local_120._104_8_,local_a8._M_allocated_capacity + 1);
    }
    if ((pIVar6 != (InternalKey *)0x0) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2)) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((pIVar5 != (InternalKey *)0x0) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_allocated_capacity != &local_68)) {
      operator_delete((void *)local_78._M_allocated_capacity,local_68._M_allocated_capacity + 1);
    }
  }
  local_148.state_ = (char *)0x0;
  if (this_00 != (Compaction *)0x0) {
    if (pMVar2 == (ManualCompaction *)0x0) {
      bVar11 = Compaction::IsTrivialMove(this_00);
      if (!bVar11) goto LAB_0066cea9;
      ppFVar3 = this_00->inputs_[0].
                super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (((long)this_00->inputs_[0].
                 super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar3 & 0x7fffffff8U) != 8) {
        __assert_fail("c->num_input_files(0) == 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/db/db_impl.cc"
                      ,0x2da,"void leveldb::DBImpl::BackgroundCompaction()");
      }
      pFVar7 = *ppFVar3;
      local_120._8_8_ = pFVar7->number;
      local_120._0_4_ = this_00->level_;
      std::
      _Rb_tree<std::pair<int,unsigned_long>,std::pair<int,unsigned_long>,std::_Identity<std::pair<int,unsigned_long>>,std::less<std::pair<int,unsigned_long>>,std::allocator<std::pair<int,unsigned_long>>>
      ::_M_insert_unique<std::pair<int,unsigned_long>>
                ((_Rb_tree<std::pair<int,unsigned_long>,std::pair<int,unsigned_long>,std::_Identity<std::pair<int,unsigned_long>>,std::less<std::pair<int,unsigned_long>>,std::allocator<std::pair<int,unsigned_long>>>
                  *)&(this_00->edit_).deleted_files_,(pair<int,_unsigned_long> *)local_120);
      VersionEdit::AddFile
                (&this_00->edit_,this_00->level_ + 1,pFVar7->number,pFVar7->file_size,
                 &pFVar7->smallest,&pFVar7->largest);
      VersionSet::LogAndApply
                ((VersionSet *)local_120,(VersionEdit *)this->versions_,(Mutex *)&this_00->edit_);
      SVar10.state_ = local_148.state_;
      local_148.state_ = (char *)local_120._0_8_;
      local_120._0_8_ = SVar10.state_;
      if ((Env *)SVar10.state_ != (Env *)0x0) {
        operator_delete__(SVar10.state_);
      }
      if ((Env *)local_148.state_ != (Env *)0x0) {
        RecordBackgroundError(this,&local_148);
      }
      pLVar4 = (this->options_).info_log;
      uVar8 = pFVar7->number;
      uVar9 = pFVar7->file_size;
      iVar1 = this_00->level_;
      Status::ToString_abi_cxx11_(&local_140,&local_148);
      _Var13._M_p = local_140._M_dataplus._M_p;
      pcVar12 = VersionSet::LevelSummary(this->versions_,(LevelSummaryStorage *)local_120);
      Log(pLVar4,"Moved #%lld to level-%d %lld bytes %s: %s\n",uVar8,(ulong)(iVar1 + 1),uVar9,
          _Var13._M_p,pcVar12);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != &local_140.field_2) {
        operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
      }
    }
    else {
LAB_0066cea9:
      compact = (CompactionState *)operator_new(0x40);
      compact->compaction = this_00;
      compact->smallest_snapshot = 0;
      (compact->outputs).
      super__Vector_base<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (compact->outputs).
      super__Vector_base<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (compact->outputs).
      super__Vector_base<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      compact->outfile = (WritableFile *)0x0;
      compact->builder = (TableBuilder *)0x0;
      compact->total_bytes = 0;
      DoCompactionWork((DBImpl *)local_120,(CompactionState *)this);
      SVar10.state_ = local_148.state_;
      local_148.state_ = (char *)local_120._0_8_;
      local_120._0_8_ = SVar10.state_;
      if ((Env *)SVar10.state_ != (Env *)0x0) {
        operator_delete__(SVar10.state_);
      }
      if ((Env *)local_148.state_ != (Env *)0x0) {
        RecordBackgroundError(this,&local_148);
      }
      CleanupCompaction(this,compact);
      Compaction::ReleaseInputs(this_00);
      DeleteObsoleteFiles(this);
    }
    Compaction::~Compaction(this_00);
    operator_delete(this_00,0x158);
  }
  if (((Env *)local_148.state_ != (Env *)0x0) && (((this->shutting_down_)._M_base._M_i & 1U) == 0))
  {
    pLVar4 = (this->options_).info_log;
    Status::ToString_abi_cxx11_((string *)local_120,&local_148);
    Log(pLVar4,"Compaction error: %s",local_120._0_8_);
    if ((Env *)local_120._0_8_ != (Env *)(local_120 + 0x10)) {
      operator_delete((void *)local_120._0_8_,local_120._16_8_ + 1);
    }
  }
  if (pMVar2 != (ManualCompaction *)0x0) {
    pMVar2 = this->manual_compaction_;
    if ((Env *)local_148.state_ != (Env *)0x0) {
      pMVar2->done = true;
    }
    if (pMVar2->done == false) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                (&(pMVar2->tmp_storage).rep_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
      pMVar2->begin = &pMVar2->tmp_storage;
    }
    this->manual_compaction_ = (ManualCompaction *)0x0;
  }
  if ((Env *)local_148.state_ != (Env *)0x0) {
    operator_delete__(local_148.state_);
  }
  if ((undefined1 *)local_58._0_8_ != local_58 + 0x10) {
    operator_delete((void *)local_58._0_8_,CONCAT71(local_58._17_7_,local_58[0x10]) + 1);
  }
  if (*(__pthread_internal_list **)(in_FS_OFFSET + 0x28) ==
      (__pthread_internal_list *)local_58._32_8_) {
    return;
  }
LAB_0066d20d:
  __stack_chk_fail();
}

Assistant:

void DBImpl::BackgroundCompaction() {
  mutex_.AssertHeld();

  if (imm_ != nullptr) {
    CompactMemTable();
    return;
  }

  Compaction* c;
  bool is_manual = (manual_compaction_ != nullptr);
  InternalKey manual_end;
  if (is_manual) {
    ManualCompaction* m = manual_compaction_;
    c = versions_->CompactRange(m->level, m->begin, m->end);
    m->done = (c == nullptr);
    if (c != nullptr) {
      manual_end = c->input(0, c->num_input_files(0) - 1)->largest;
    }
    Log(options_.info_log,
        "Manual compaction at level-%d from %s .. %s; will stop at %s\n",
        m->level, (m->begin ? m->begin->DebugString().c_str() : "(begin)"),
        (m->end ? m->end->DebugString().c_str() : "(end)"),
        (m->done ? "(end)" : manual_end.DebugString().c_str()));
  } else {
    c = versions_->PickCompaction();
  }

  Status status;
  if (c == nullptr) {
    // Nothing to do
  } else if (!is_manual && c->IsTrivialMove()) {
    // Move file to next level
    assert(c->num_input_files(0) == 1);
    FileMetaData* f = c->input(0, 0);
    c->edit()->DeleteFile(c->level(), f->number);
    c->edit()->AddFile(c->level() + 1, f->number, f->file_size, f->smallest,
                       f->largest);
    status = versions_->LogAndApply(c->edit(), &mutex_);
    if (!status.ok()) {
      RecordBackgroundError(status);
    }
    VersionSet::LevelSummaryStorage tmp;
    Log(options_.info_log, "Moved #%lld to level-%d %lld bytes %s: %s\n",
        static_cast<unsigned long long>(f->number), c->level() + 1,
        static_cast<unsigned long long>(f->file_size),
        status.ToString().c_str(), versions_->LevelSummary(&tmp));
  } else {
    CompactionState* compact = new CompactionState(c);
    status = DoCompactionWork(compact);
    if (!status.ok()) {
      RecordBackgroundError(status);
    }
    CleanupCompaction(compact);
    c->ReleaseInputs();
    DeleteObsoleteFiles();
  }
  delete c;

  if (status.ok()) {
    // Done
  } else if (shutting_down_.load(std::memory_order_acquire)) {
    // Ignore compaction errors found during shutting down
  } else {
    Log(options_.info_log, "Compaction error: %s", status.ToString().c_str());
  }

  if (is_manual) {
    ManualCompaction* m = manual_compaction_;
    if (!status.ok()) {
      m->done = true;
    }
    if (!m->done) {
      // We only compacted part of the requested range.  Update *m
      // to the range that is left to be compacted.
      m->tmp_storage = manual_end;
      m->begin = &m->tmp_storage;
    }
    manual_compaction_ = nullptr;
  }
}